

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_features.cpp
# Opt level: O0

bool __thiscall
Am_Feature_Vector_Data::operator==(Am_Feature_Vector_Data *this,Am_Wrapper *test_value)

{
  uint uVar1;
  uint uVar2;
  bool local_31;
  Am_Wrapper *test_value_local;
  Am_Feature_Vector_Data *this_local;
  
  uVar1 = (uint)id;
  uVar2 = (**(test_value->super_Am_Registered_Type)._vptr_Am_Registered_Type)();
  if (uVar1 == (uVar2 & 0xffff)) {
    local_31 = true;
    if ((Am_Feature_Vector_Data *)test_value != this) {
      local_31 = operator==((Am_Feature_Vector_Data *)test_value,this);
    }
    this_local._7_1_ = local_31;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

Am_Feature_Vector_Data::Am_Feature_Vector_Data()
{
  int i;

  y = NewVector(NFEATURES);

  npoints = 0;
  initial_sin = initial_cos = 0.0;
  path_r = 0;
  path_th = 0;
  abs_th = 0;
  sharpness = 0;
  for (i = 0; i < NFEATURES; i++)
    y[i] = 0.0;
  calculated = false;
}